

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitResume(InternalAnalyzer *this,Resume *curr)

{
  EffectAnalyzer *pEVar1;
  
  pEVar1 = this->parent;
  pEVar1->calls = true;
  pEVar1->implicitTrap = true;
  if ((((pEVar1->features).features & 0x40) != 0) && (pEVar1->tryDepth == 0)) {
    pEVar1->throws_ = true;
  }
  return;
}

Assistant:

void visitResume(Resume* curr) {
      // This acts as a kitchen sink effect.
      parent.calls = true;

      // resume instructions accept nullable continuation references and trap
      // on null.
      parent.implicitTrap = true;

      if (parent.features.hasExceptionHandling() && parent.tryDepth == 0) {
        parent.throws_ = true;
      }
    }